

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

uint32_t __thiscall
diligent_spirv_cross::Compiler::get_execution_mode_argument
          (Compiler *this,ExecutionMode mode,uint32_t index)

{
  SPIREntryPoint *pSVar1;
  SPIRConstant *pSVar2;
  uint32_t uVar3;
  
  pSVar1 = get_entry_point(this);
  if (mode == ExecutionModeInvocations) {
    uVar3 = pSVar1->invocations;
  }
  else if (mode == ExecutionModeLocalSize) {
    if (index == 2) {
      if ((((pSVar1->flags).lower & 0x4000000000) == 0) ||
         (uVar3 = (pSVar1->workgroup_size).id_z, uVar3 == 0)) {
        return (pSVar1->workgroup_size).z;
      }
    }
    else if (index == 1) {
      if ((((pSVar1->flags).lower & 0x4000000000) == 0) ||
         (uVar3 = (pSVar1->workgroup_size).id_y, uVar3 == 0)) {
        return (pSVar1->workgroup_size).y;
      }
    }
    else {
      if (index != 0) {
        return 0;
      }
      if ((((pSVar1->flags).lower & 0x4000000000) == 0) ||
         (uVar3 = (pSVar1->workgroup_size).id_x, uVar3 == 0)) {
        return (pSVar1->workgroup_size).x;
      }
    }
    pSVar2 = get<diligent_spirv_cross::SPIRConstant>(this,uVar3);
    uVar3 = (pSVar2->m).c[0].r[0].u32;
  }
  else if (mode == ExecutionModeOutputVertices) {
    uVar3 = pSVar1->output_vertices;
  }
  else if (mode == ExecutionModeOutputPrimitivesEXT) {
    uVar3 = pSVar1->output_primitives;
  }
  else {
    uVar3 = 0;
    if ((mode == ExecutionModeLocalSizeId) &&
       (uVar3 = 0, ((pSVar1->flags).lower & 0x4000000000) != 0)) {
      if (index == 2) {
        uVar3 = (pSVar1->workgroup_size).id_z;
      }
      else if (index == 1) {
        uVar3 = (pSVar1->workgroup_size).id_y;
      }
      else if (index == 0) {
        uVar3 = (pSVar1->workgroup_size).id_x;
      }
    }
  }
  return uVar3;
}

Assistant:

uint32_t Compiler::get_execution_mode_argument(spv::ExecutionMode mode, uint32_t index) const
{
	auto &execution = get_entry_point();
	switch (mode)
	{
	case ExecutionModeLocalSizeId:
		if (execution.flags.get(ExecutionModeLocalSizeId))
		{
			switch (index)
			{
			case 0:
				return execution.workgroup_size.id_x;
			case 1:
				return execution.workgroup_size.id_y;
			case 2:
				return execution.workgroup_size.id_z;
			default:
				return 0;
			}
		}
		else
			return 0;

	case ExecutionModeLocalSize:
		switch (index)
		{
		case 0:
			if (execution.flags.get(ExecutionModeLocalSizeId) && execution.workgroup_size.id_x != 0)
				return get<SPIRConstant>(execution.workgroup_size.id_x).scalar();
			else
				return execution.workgroup_size.x;
		case 1:
			if (execution.flags.get(ExecutionModeLocalSizeId) && execution.workgroup_size.id_y != 0)
				return get<SPIRConstant>(execution.workgroup_size.id_y).scalar();
			else
				return execution.workgroup_size.y;
		case 2:
			if (execution.flags.get(ExecutionModeLocalSizeId) && execution.workgroup_size.id_z != 0)
				return get<SPIRConstant>(execution.workgroup_size.id_z).scalar();
			else
				return execution.workgroup_size.z;
		default:
			return 0;
		}

	case ExecutionModeInvocations:
		return execution.invocations;

	case ExecutionModeOutputVertices:
		return execution.output_vertices;

	case ExecutionModeOutputPrimitivesEXT:
		return execution.output_primitives;

	default:
		return 0;
	}
}